

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O3

void report_weapon_skill(CHAR_DATA *ch,OBJ_DATA *obj)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *format;
  string_view fmt;
  
  bVar1 = is_npc(ch);
  if (bVar1) {
    return;
  }
  if (obj->item_type == 5) {
    uVar2 = obj->value[0] - 1;
    if (((uVar2 < 9) && ((0x13fU >> (uVar2 & 0x1f) & 1) != 0)) &&
       ((long)*(short *)(&PTR_gsn_sword_0044d808)[uVar2] != -1)) {
      iVar3 = (int)ch->pcdata->learned[*(short *)(&PTR_gsn_sword_0044d808)[uVar2]];
    }
    else {
      iVar3 = ch->level * 3;
    }
    if (iVar3 < 100) {
      if (iVar3 < 0x56) {
        if (iVar3 < 0x47) {
          if (iVar3 < 0x33) {
            if (iVar3 < 0x1a) {
              if (iVar3 < 2) {
                format = "You don\'t even know which end is up on $p.";
              }
              else {
                format = "You fumble and almost drop $p.";
              }
            }
            else {
              format = "$p feels a little clumsy in your hands.";
            }
          }
          else {
            format = "Your skill with $p is adequate.";
          }
        }
        else {
          format = "You are skilled with $p.";
        }
      }
      else {
        format = "You feel quite confident with $p.";
      }
    }
    else {
      format = "$p feels like a part of you!";
    }
    act(format,ch,obj,(void *)0x0,3);
    return;
  }
  fmt._M_str = "report_weapon_skill: Bad obj->type, {}, vnum {}, carried by {}.";
  fmt._M_len = 0x3f;
  CLogger::Debug<short&,short&,char*&>
            ((CLogger *)&RS.field_0x140,fmt,&obj->item_type,&obj->pIndexData->vnum,&ch->name);
  return;
}

Assistant:

void report_weapon_skill(CHAR_DATA *ch, OBJ_DATA *obj)
{
	int skill, sn;

	if (is_npc(ch))
		return;

	if (obj->item_type != ITEM_WEAPON)
	{
		RS.Logger.Debug("report_weapon_skill: Bad obj->type, {}, vnum {}, carried by {}.", 
			obj->item_type,
			obj->pIndexData->vnum,
			ch->name);
		return;
	}

	if (obj->value[0] == WEAPON_DAGGER)
		sn = gsn_dagger;
	else if (obj->value[0] == WEAPON_SWORD)
		sn = gsn_sword;
	else if (obj->value[0] == WEAPON_MACE)
		sn = gsn_mace;
	else if (obj->value[0] == WEAPON_SPEAR)
		sn = gsn_spear;
	else if (obj->value[0] == WEAPON_AXE)
		sn = gsn_axe;
	else if (obj->value[0] == WEAPON_FLAIL)
		sn = gsn_flail;
	else if (obj->value[0] == WEAPON_STAFF)
		sn = gsn_staff;
	else
		sn = -1;

	if (sn == -1)
		skill = ch->level * 3;
	else
		skill = ch->pcdata->learned[sn];

	if (skill >= 100)
		act("$p feels like a part of you!", ch, obj, nullptr, TO_CHAR);
	else if (skill > 85)
		act("You feel quite confident with $p.", ch, obj, 0, TO_CHAR);
	else if (skill > 70)
		act("You are skilled with $p.", ch, obj, 0, TO_CHAR);
	else if (skill > 50)
		act("Your skill with $p is adequate.", ch, obj, 0, TO_CHAR);
	else if (skill > 25)
		act("$p feels a little clumsy in your hands.", ch, obj, 0, TO_CHAR);
	else if (skill > 1)
		act("You fumble and almost drop $p.", ch, obj, 0, TO_CHAR);
	else
		act("You don't even know which end is up on $p.", ch, obj, 0, TO_CHAR);
}